

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ecdsa_adaptor.cpp
# Opt level: O0

void __thiscall ECDSAAdaptor_Adapt_Test::TestBody(ECDSAAdaptor_Adapt_Test *this)

{
  SigHashType *this_00;
  bool bVar1;
  char *message;
  AssertHelper local_c0;
  Message local_b8;
  string local_b0;
  string local_90;
  undefined1 local_70 [8];
  AssertionResult gtest_ar;
  undefined1 local_50 [8];
  ByteData sig;
  ByteData raw_sig;
  SigHashType sig_hash;
  ECDSAAdaptor_Adapt_Test *this_local;
  
  this_00 = (SigHashType *)
            ((long)&raw_sig.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 4);
  cfd::core::SigHashType::SigHashType(this_00);
  cfd::core::CryptoUtil::ConvertSignatureFromDer
            ((ByteData *)
             &sig.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&sig_der,this_00);
  cfd::core::AdaptorUtil::Adapt((ByteData *)local_50,&adaptor_sig2,&secret);
  cfd::core::ByteData::GetHex_abi_cxx11_
            (&local_90,
             (ByteData *)
             &sig.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_b0,(ByteData *)local_50);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_70,"raw_sig.GetHex()","sig.GetHex()",&local_90,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_ecdsa_adaptor.cpp"
               ,0x3e,message);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  cfd::core::ByteData::~ByteData((ByteData *)local_50);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &sig.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST(ECDSAAdaptor, Adapt) {
  SigHashType sig_hash;
  auto raw_sig = CryptoUtil::ConvertSignatureFromDer(sig_der, &sig_hash);
  auto sig = AdaptorUtil::Adapt(adaptor_sig2, secret);

  EXPECT_EQ(raw_sig.GetHex(), sig.GetHex());
}